

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,BxDFFlags flags)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Unset","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (((ulong)this & 1) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (((ulong)this & 2) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (((ulong)this & 4) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (((ulong)this & 8) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (((ulong)this & 0x10) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(BxDFFlags flags) {
    if (flags == BxDFFlags::Unset)
        return "Unset";
    std::string s;
    if (flags & BxDFFlags::Reflection)
        s += "Reflection,";
    if (flags & BxDFFlags::Transmission)
        s += "Transmission,";
    if (flags & BxDFFlags::Diffuse)
        s += "Diffuse,";
    if (flags & BxDFFlags::Glossy)
        s += "Glossy,";
    if (flags & BxDFFlags::Specular)
        s += "Specular,";
    return s;
}